

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaSetValidErrors
               (xmlSchemaValidCtxtPtr ctxt,xmlSchemaValidityErrorFunc err,
               xmlSchemaValidityWarningFunc warn,void *ctx)

{
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->errCtxt = ctx;
    if (ctxt->pctxt != (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaSetParserErrors(ctxt->pctxt,err,warn,ctx);
      return;
    }
  }
  return;
}

Assistant:

void
xmlSchemaSetValidErrors(xmlSchemaValidCtxtPtr ctxt,
                        xmlSchemaValidityErrorFunc err,
                        xmlSchemaValidityWarningFunc warn, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->errCtxt = ctx;
    if (ctxt->pctxt != NULL)
	xmlSchemaSetParserErrors(ctxt->pctxt, err, warn, ctx);
}